

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O3

void __thiscall trun::ResultsReportJSON::PrintAssert(ResultsReportJSON *this,AssertErrorItem *aerr)

{
  char *this_00;
  string local_38;
  
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"File\" : \"%s\",",(aerr->file)._M_dataplus._M_p
            );
  this_00 = "\"Line\" : %d,";
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"Line\" : %d,",(ulong)(uint)aerr->line);
  EscapeString(&local_38,(ResultsReportJSON *)this_00,&aerr->message);
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"Message\" : \"%s\"",local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  return;
}

Assistant:

void ResultsReportJSON::PrintAssert(const AssertError::AssertErrorItem &aerr) {
    PushIndent();
    WriteLine(R"("File" : "%s",)", aerr.file.c_str());
    WriteLine(R"("Line" : %d,)", aerr.line);
    WriteLine(R"("Message" : "%s")", EscapeString(aerr.message).c_str());
    PopIndent();
}